

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

int vm_builtin_defined(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  jx9_value *pObj;
  uint in_EAX;
  char *pKey;
  SyHashEntry_Pr *pSVar1;
  anon_union_8_3_18420de5_for_x aVar2;
  int nLen;
  undefined8 uStack_18;
  
  uStack_18 = (ulong)in_EAX;
  if (nArg < 1) {
    jx9VmThrowError(pCtx->pVm,&pCtx->pFunc->sName,3,"Missing constant name");
  }
  else {
    pKey = jx9_value_to_string(*apArg,(int *)((long)&uStack_18 + 4));
    if ((0 < (int)uStack_18._4_4_) && ((pCtx->pVm->hConstant).nEntry != 0)) {
      pSVar1 = HashGetEntry(&pCtx->pVm->hConstant,pKey,uStack_18._4_4_);
      aVar2.iVal._1_7_ = 0;
      aVar2.iVal._0_1_ = pSVar1 != (SyHashEntry_Pr *)0x0;
      goto LAB_0012bb49;
    }
  }
  aVar2.rVal = 0.0;
LAB_0012bb49:
  pObj = pCtx->pRet;
  jx9MemObjRelease(pObj);
  pObj->x = aVar2;
  pObj->iFlags = pObj->iFlags & 0xfffffe90U | 8;
  return 0;
}

Assistant:

static int vm_builtin_defined(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const char *zName;
	int nLen = 0;
	int res = 0;
	if( nArg < 1 ){
		/* Missing constant name, return FALSE */
		jx9_context_throw_error(pCtx,JX9_CTX_NOTICE,"Missing constant name");
		jx9_result_bool(pCtx, 0);
		return SXRET_OK;
	}
	/* Extract constant name */
	zName = jx9_value_to_string(apArg[0], &nLen);
	/* Perform the lookup */
	if( nLen > 0 && SyHashGet(&pCtx->pVm->hConstant, (const void *)zName, (sxu32)nLen) != 0 ){
		/* Already defined */
		res = 1;
	}
	jx9_result_bool(pCtx, res);
	return SXRET_OK;
}